

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_NeString_Test<char>::Body
          (iu_StrTest_x_iutest_x_NeString_Test<char> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  bool bVar1;
  char *pcVar2;
  type **in_stack_ffffffffffffeca8;
  Fixed *this_00;
  AssertionHelper local_12d8;
  Fixed local_12a8;
  string local_1120 [32];
  undefined1 local_1100 [8];
  AssertionResult iutest_ar_8;
  Fixed local_10a8;
  string local_f20 [32];
  undefined1 local_f00 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_ed0;
  Fixed local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  string local_cf8 [32];
  undefined1 local_cd8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_c80;
  string local_af8 [32];
  undefined1 local_ad8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_a80;
  string local_8f8 [32];
  undefined1 local_8d8 [8];
  AssertionResult iutest_ar_4;
  Fixed local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8 [32];
  undefined1 local_6b8 [8];
  AssertionResult iutest_ar_3;
  Fixed local_660;
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  AssertionResult iutest_ar_2;
  Fixed local_460;
  string local_2d8 [32];
  undefined1 local_2b8 [8];
  AssertionResult iutest_ar_1;
  Fixed local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult iutest_ar;
  string local_68 [8];
  String Test;
  allocator<char> local_31;
  string local_30 [8];
  String test;
  iu_StrTest_x_iutest_x_NeString_Test<char> *this_local;
  
  pcVar2 = text<char>::test;
  test.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator(&local_31);
  __s = text<char>::Test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,(char *)__s,(allocator<char> *)&iutest_ar.field_0x27);
  std::allocator<char>::~allocator((allocator<char> *)&iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_b8,local_30);
  std::__cxx11::string::string((string *)&local_d8,local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_98,(internal *)0x551911,"Test",(char *)local_b8,&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string(local_b8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    memset(&local_260,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_260);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_98);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x87,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_260);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_260);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  iutest::detail::AlwaysZero();
  pcVar2 = text<char>::test;
  std::__cxx11::string::string(local_2d8,local_68);
  iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_2b8,(internal *)"TestFixture::Text::test","Test",pcVar2,
             (char *)local_2d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_2d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    memset(&local_460,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_460);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_2b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x88,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_460);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_460);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_4d8,local_30);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_4b8,(internal *)0x551911,"TestFixture::Text::Test",
             (char *)local_4d8,text<char>::Test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_4d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    memset(&local_660,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_660);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_4b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x89,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_660);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_660);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_6d8,local_30);
  std::__cxx11::string::string((string *)&local_6f8,local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_6b8,(internal *)0x551911,"Test",(char *)local_6d8,&local_6f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string(local_6d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    memset(&local_880,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_880);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_6b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_880);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_880);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  iutest::detail::AlwaysZero();
  pcVar2 = text<char>::test;
  std::__cxx11::string::string(local_8f8,local_68);
  iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_8d8,(internal *)"TestFixture::Text::test","Test",pcVar2,
             (char *)local_8f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_8f8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar1) {
    memset(&local_a80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a80);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8d8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_a80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_af8,local_30);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_ad8,(internal *)0x551911,"TestFixture::Text::Test",
             (char *)local_af8,text<char>::Test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_af8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar1) {
    memset(&local_c80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_c80);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_ad8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_c80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_c80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_cf8,local_30);
  std::__cxx11::string::string((string *)&local_d18,local_68);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_cd8,(internal *)0x551911,"Test",(char *)local_cf8,&local_d18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::string::~string(local_cf8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar1) {
    memset(&local_ea0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_ea0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_cd8);
    iutest::AssertionHelper::AssertionHelper
              (&local_ed0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x8f,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_ed0,&local_ea0);
    iutest::AssertionHelper::~AssertionHelper(&local_ed0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_ea0);
  }
  iutest_ar_7._37_3_ = 0;
  iutest_ar_7._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  if (iutest_ar_7._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    pcVar2 = text<char>::test;
    std::__cxx11::string::string(local_f20,local_68);
    iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
              ((AssertionResult *)local_f00,(internal *)"TestFixture::Text::test","Test",pcVar2,
               (char *)local_f20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
    std::__cxx11::string::~string(local_f20);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f00);
    if (!bVar1) {
      memset(&local_10a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_10a8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f00);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_8.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x90,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_10a8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_10a8);
    }
    iutest_ar_7._37_3_ = 0;
    iutest_ar_7._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f00);
    if (iutest_ar_7._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      std::__cxx11::string::string(local_1120,local_30);
      iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
                ((AssertionResult *)local_1100,(internal *)0x551911,"TestFixture::Text::Test",
                 (char *)local_1120,text<char>::Test,
                 (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
      std::__cxx11::string::~string(local_1120);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
      if (!bVar1) {
        this_00 = &local_12a8;
        memset(this_00,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(this_00);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1100);
        iutest::AssertionHelper::AssertionHelper
                  (&local_12d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                   ,0x91,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_12d8,&local_12a8);
        iutest::AssertionHelper::~AssertionHelper(&local_12d8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_12a8);
      }
      iutest_ar_7._37_3_ = 0;
      iutest_ar_7._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
      if (iutest_ar_7._36_4_ == 0) {
        iutest_ar_7._36_4_ = 0;
      }
    }
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRNE(test, Test);
    IUTEST_INFORM_STRNE(TestFixture::Text::test, Test);
    IUTEST_INFORM_STRNE(test, TestFixture::Text::Test);

    IUTEST_EXPECT_STRNE(test, Test);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, Test);
    IUTEST_EXPECT_STRNE(test, TestFixture::Text::Test);

    IUTEST_ASSERT_STRNE(test, Test);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, Test);
    IUTEST_ASSERT_STRNE(test, TestFixture::Text::Test);
}